

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

string * testing::internal::StripTrailingSpaces(string *str)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  string *in_RSI;
  string *in_RDI;
  iterator it;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18 [3];
  
  local_18[0]._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    std::__cxx11::string::begin();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb7 = false;
    if (bVar1) {
      this = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator--(local_18);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(this);
      in_stack_ffffffffffffffb7 = IsSpace('\0');
    }
    if ((bool)in_stack_ffffffffffffffb7 == false) break;
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    local_18[0]._M_current = (char *)std::__cxx11::string::erase(in_RSI,local_30);
  }
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

inline std::string StripTrailingSpaces(std::string str) {
  std::string::iterator it = str.end();
  while (it != str.begin() && IsSpace(*--it))
    it = str.erase(it);
  return str;
}